

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O1

Node * node_new_ctype(int type,int not,OnigOptionType options)

{
  Node *pNVar1;
  Bits BVar2;
  
  pNVar1 = (Node *)malloc(0x48);
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = (Node *)0x0;
  }
  else {
    (pNVar1->u).quant.next_head_exact = (_Node *)0x0;
    (pNVar1->u).cclass.mbuf = (BBuf *)0x0;
    (pNVar1->u).call.name = (OnigUChar *)0x0;
    (pNVar1->u).quant.head_exact = (_Node *)0x0;
    (pNVar1->u).base.body = (_Node *)0x0;
    (pNVar1->u).str.end = (OnigUChar *)0x0;
    *(undefined8 *)&pNVar1->u = 0;
    (pNVar1->u).base.parent = (_Node *)0x0;
    *(undefined8 *)((long)&pNVar1->u + 0x40) = 0;
  }
  BVar2 = 0;
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = (Node *)0x0;
  }
  else {
    (pNVar1->u).base.node_type = ND_CTYPE;
    (pNVar1->u).backref.back_num = type;
    (pNVar1->u).backref.back_static[0] = not;
    if ((((-1 < type) && (BVar2 = 1, (options >> 0x13 & 1) == 0)) &&
        ((type == 0xc & (byte)(options >> 0x10) & 1) == 0)) &&
       ((type == 4 & (byte)(options >> 0x11) & 1) == 0)) {
      BVar2 = (Bits)((byte)(options >> 0x12) & 1 & type == 9);
    }
    (pNVar1->u).cclass.bs[1] = BVar2;
  }
  return pNVar1;
}

Assistant:

static Node*
node_new_ctype(int type, int not, OnigOptionType options)
{
  Node* node = node_new();
  CHECK_NULL_RETURN(node);

  ND_SET_TYPE(node, ND_CTYPE);
  CTYPE_(node)->ctype   = type;
  CTYPE_(node)->not     = not;
  CTYPE_(node)->ascii_mode = OPTON_IS_ASCII_MODE_CTYPE(type, options);
  return node;
}